

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngIsValid(void)

{
  bool_t b;
  undefined4 local_4;
  
  if (_inited == 0) {
    local_4 = 0;
  }
  else {
    mtMtxLock((mt_mtx_t *)0x11cda0);
    local_4 = rngIsValid_internal();
    mtMtxUnlock((mt_mtx_t *)0x11cdb4);
  }
  return local_4;
}

Assistant:

bool_t rngIsValid()
{
	bool_t b;
	if (!_inited)
		return FALSE;
	mtMtxLock(_mtx);
	b = rngIsValid_internal();
	mtMtxUnlock(_mtx);
	return b;
}